

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O1

void __thiscall
google::protobuf::internal::ArenaImpl::ArenaImpl<google::protobuf::ArenaOptions>
          (ArenaImpl *this,ArenaOptions *options)

{
  char *pcVar1;
  ulong uVar2;
  LogMessage *pLVar3;
  Block *pBVar4;
  LogMessage local_60;
  LogFinisher local_21;
  
  (this->options_).start_block_size = options->start_block_size;
  (this->options_).max_block_size = options->max_block_size;
  pcVar1 = options->initial_block;
  (this->options_).initial_block = pcVar1;
  (this->options_).initial_block_size = options->initial_block_size;
  (this->options_).block_alloc = options->block_alloc;
  (this->options_).block_dealloc = options->block_dealloc;
  if ((pcVar1 == (char *)0x0) || (uVar2 = (this->options_).initial_block_size, uVar2 == 0)) {
    pBVar4 = (Block *)0x0;
  }
  else {
    if (uVar2 < 0x18) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/arena_impl.h"
                 ,0x59);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (options_.initial_block_size) >= (sizeof(Block)): ");
      pLVar3 = LogMessage::operator<<(pLVar3,": Initial block size too small for header.");
      LogFinisher::operator=(&local_21,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    pBVar4 = (Block *)(this->options_).initial_block;
  }
  this->initial_block_ = pBVar4;
  Init(this);
  return;
}

Assistant:

explicit ArenaImpl(const O& options) : options_(options) {
    if (options_.initial_block != NULL && options_.initial_block_size > 0) {
      GOOGLE_CHECK_GE(options_.initial_block_size, sizeof(Block))
          << ": Initial block size too small for header.";
      initial_block_ = reinterpret_cast<Block*>(options_.initial_block);
    } else {
      initial_block_ = NULL;
    }

    Init();
  }